

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_fuzzer.cc
# Opt level: O0

void __thiscall FuzzHelper::doChecks(FuzzHelper *this)

{
  uchar *puVar1;
  ulong uVar2;
  shared_ptr<InputSource> local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_88;
  undefined1 local_80 [8];
  shared_ptr<BufferInputSource> is;
  Buffer buf;
  QPDF q;
  runtime_error *e;
  allocator local_41;
  string local_40;
  JSON local_20;
  FuzzHelper *local_10;
  FuzzHelper *this_local;
  
  puVar1 = this->data;
  uVar2 = this->size;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,(char *)puVar1,uVar2,&local_41);
  JSON::parse(&local_20,&local_40);
  JSON::~JSON(&local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  QPDF::QPDF((QPDF *)&buf);
  QPDF::setMaxWarnings((QPDF *)&buf,1000);
  Buffer::Buffer((Buffer *)
                 &is.super___shared_ptr<BufferInputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 this->data,this->size);
  local_88 = &is.super___shared_ptr<BufferInputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::make_shared<BufferInputSource,char_const(&)[5],Buffer*>
            ((char (*) [5])local_80,(Buffer **)0x43a986);
  std::shared_ptr<InputSource>::shared_ptr<BufferInputSource,void>
            (&local_98,(shared_ptr<BufferInputSource> *)local_80);
  QPDF::createFromJSON((QPDF *)&buf,&local_98);
  std::shared_ptr<InputSource>::~shared_ptr(&local_98);
  std::shared_ptr<BufferInputSource>::~shared_ptr((shared_ptr<BufferInputSource> *)local_80);
  Buffer::~Buffer((Buffer *)
                  &is.super___shared_ptr<BufferInputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  QPDF::~QPDF((QPDF *)&buf);
  return;
}

Assistant:

void
FuzzHelper::doChecks()
{
    try {
        JSON::parse(std::string(reinterpret_cast<char const*>(data), size));
    } catch (std::runtime_error& e) {
        std::cerr << "runtime_error parsing json: " << e.what() << std::endl;
    }
    QPDF q;
    q.setMaxWarnings(1000);
    Buffer buf(const_cast<unsigned char*>(data), size);
    auto is = std::make_shared<BufferInputSource>("json", &buf);
    q.createFromJSON(is);
}